

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

hwaddr S1_ptw_translate(CPUARMState_conflict *env,ARMMMUIdx mmu_idx,hwaddr addr,MemTxAttrs txattrs,
                       ARMMMUFaultInfo_conflict1 *fi)

{
  _Bool _Var1;
  ARMCacheAttrs *local_68;
  ARMCacheAttrs *pcacheattrs;
  uint local_58;
  ARMCacheAttrs cacheattrs;
  int ret;
  int s2prot;
  hwaddr s2pa;
  target_ulong s2size;
  ARMMMUFaultInfo_conflict1 *fi_local;
  hwaddr addr_local;
  CPUARMState_conflict *pCStack_28;
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  MemTxAttrs txattrs_local;
  
  s2size = (target_ulong)fi;
  fi_local = (ARMMMUFaultInfo_conflict1 *)addr;
  addr_local._4_4_ = mmu_idx;
  pCStack_28 = env;
  env_local._4_4_ = txattrs;
  _Var1 = arm_mmu_idx_is_stage1_of_2(mmu_idx);
  if ((_Var1) && (_Var1 = regime_translation_disabled(pCStack_28,ARMMMUIdx_Stage2), !_Var1)) {
    pcacheattrs._4_4_ = 0;
    local_68 = (ARMCacheAttrs *)0x0;
    if (((pCStack_28->cp15).hcr_el2 & 4) != 0) {
      local_68 = (ARMCacheAttrs *)((long)&pcacheattrs + 4);
    }
    _Var1 = get_phys_addr_lpae(pCStack_28,(target_ulong)fi_local,MMU_DATA_LOAD,ARMMMUIdx_Stage2,
                               (hwaddr *)&ret,(MemTxAttrs *)((long)&env_local + 4),
                               (int *)&cacheattrs,&s2pa,(ARMMMUFaultInfo_conflict1 *)s2size,local_68
                              );
    local_58 = (uint)_Var1;
    if (local_58 != 0) {
      if (*(int *)s2size != 0) {
        *(ARMMMUFaultInfo_conflict1 **)(s2size + 8) = fi_local;
        *(undefined1 *)(s2size + 0x18) = 1;
        *(undefined1 *)(s2size + 0x19) = 1;
        return 0xffffffffffffffff;
      }
      __assert_fail("fi->type != ARMFault_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x247c,
                    "hwaddr S1_ptw_translate(CPUARMState *, ARMMMUIdx, hwaddr, MemTxAttrs, ARMMMUFaultInfo *)"
                   );
    }
    if ((local_68 != (ARMCacheAttrs *)0x0) && (((uint)*local_68 & 0xf0) == 0)) {
      *(undefined4 *)s2size = 5;
      *(ARMMMUFaultInfo_conflict1 **)(s2size + 8) = fi_local;
      *(undefined1 *)(s2size + 0x18) = 1;
      *(undefined1 *)(s2size + 0x19) = 1;
      return 0xffffffffffffffff;
    }
    fi_local = _ret;
  }
  return (hwaddr)fi_local;
}

Assistant:

static hwaddr S1_ptw_translate(CPUARMState *env, ARMMMUIdx mmu_idx,
                               hwaddr addr, MemTxAttrs txattrs,
                               ARMMMUFaultInfo *fi)
{
    if (arm_mmu_idx_is_stage1_of_2(mmu_idx) &&
        !regime_translation_disabled(env, ARMMMUIdx_Stage2)) {
        target_ulong s2size;
        hwaddr s2pa;
        int s2prot;
        int ret;
        ARMCacheAttrs cacheattrs = { 0 };
        ARMCacheAttrs *pcacheattrs = NULL;

        if (env->cp15.hcr_el2 & HCR_PTW) {
            /*
             * PTW means we must fault if this S1 walk touches S2 Device
             * memory; otherwise we don't care about the attributes and can
             * save the S2 translation the effort of computing them.
             */
            pcacheattrs = &cacheattrs;
        }

        ret = get_phys_addr_lpae(env, addr, 0, ARMMMUIdx_Stage2, &s2pa,
                                 &txattrs, &s2prot, &s2size, fi, pcacheattrs);
        if (ret) {
            assert(fi->type != ARMFault_None);
            fi->s2addr = addr;
            fi->stage2 = true;
            fi->s1ptw = true;
            return ~0;
        }
        if (pcacheattrs && (pcacheattrs->attrs & 0xf0) == 0) {
            /* Access was to Device memory: generate Permission fault */
            fi->type = ARMFault_Permission;
            fi->s2addr = addr;
            fi->stage2 = true;
            fi->s1ptw = true;
            return ~0;
        }
        addr = s2pa;
    }
    return addr;
}